

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError GetSizeParameter(GlobalConfig *global,char *arg,char *which,curl_off_t *value_out)

{
  CURLofft CVar1;
  size_t sVar2;
  byte bVar3;
  char *pcVar4;
  curl_off_t value;
  char *unit;
  long local_30;
  byte *local_28;
  
  CVar1 = curlx_strtoofft(arg,(char **)&local_28,0,&local_30);
  if (CVar1 != CURL_OFFT_OK) {
    pcVar4 = "invalid number specified for %s\n";
    goto LAB_00112866;
  }
  bVar3 = *local_28;
  if (bVar3 == 0) {
    pcVar4 = "$b";
LAB_001128a5:
    local_28 = (byte *)(pcVar4 + 1);
    bVar3 = *local_28;
  }
  else {
    sVar2 = strlen((char *)local_28);
    if (1 < sVar2) {
      pcVar4 = "$w";
      goto LAB_001128a5;
    }
  }
  if (bVar3 < 0x62) {
    if (bVar3 < 0x4b) {
      if (bVar3 == 0x42) goto LAB_0011295e;
      if (bVar3 == 0x47) goto LAB_001128de;
    }
    else {
      if (bVar3 == 0x4b) goto LAB_0011293c;
      if (bVar3 == 0x4d) goto LAB_0011291d;
    }
  }
  else if (bVar3 < 0x6b) {
    if (bVar3 == 0x62) goto LAB_0011295e;
    if (bVar3 == 0x67) {
LAB_001128de:
      if (0x1ffffffff < local_30) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      local_30 = local_30 << 0x1e;
      goto LAB_0011295e;
    }
  }
  else {
    if (bVar3 == 0x6b) {
LAB_0011293c:
      if (0x1fffffffffffff < local_30) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      local_30 = local_30 << 10;
LAB_0011295e:
      *value_out = local_30;
      return PARAM_OK;
    }
    if (bVar3 == 0x6d) {
LAB_0011291d:
      if (0x7ffffffffff < local_30) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      local_30 = local_30 << 0x14;
      goto LAB_0011295e;
    }
  }
  pcVar4 = "unsupported %s unit. Use G, M, K or B!\n";
LAB_00112866:
  warnf(global,pcVar4,which);
  return PARAM_BAD_USE;
}

Assistant:

static ParameterError GetSizeParameter(struct GlobalConfig *global,
                                       const char *arg,
                                       const char *which,
                                       curl_off_t *value_out)
{
  char *unit;
  curl_off_t value;

  if(curlx_strtoofft(arg, &unit, 0, &value)) {
    warnf(global, "invalid number specified for %s\n", which);
    return PARAM_BAD_USE;
  }

  if(!*unit)
    unit = (char *)"b";
  else if(strlen(unit) > 1)
    unit = (char *)"w"; /* unsupported */

  switch(*unit) {
  case 'G':
  case 'g':
    if(value > (CURL_OFF_T_MAX / (1024*1024*1024)))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024*1024*1024;
    break;
  case 'M':
  case 'm':
    if(value > (CURL_OFF_T_MAX / (1024*1024)))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024*1024;
    break;
  case 'K':
  case 'k':
    if(value > (CURL_OFF_T_MAX / 1024))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024;
    break;
  case 'b':
  case 'B':
    /* for plain bytes, leave as-is */
    break;
  default:
    warnf(global, "unsupported %s unit. Use G, M, K or B!\n", which);
    return PARAM_BAD_USE;
  }
  *value_out = value;
  return PARAM_OK;
}